

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadServiceWrapperBase.cpp
# Opt level: O2

void __thiscall ThreadServiceWrapperBase::Shutdown(ThreadServiceWrapperBase *this)

{
  if (this->hasScheduledIdleCollect == true) {
    this->inIdleCollect = true;
    FinishIdleCollect(this,FinishReasonNormal);
    return;
  }
  return;
}

Assistant:

void ThreadServiceWrapperBase::Shutdown()
{
    if (hasScheduledIdleCollect)
    {
#if DBG
        // Fake the inIdleCollect to get pass asserts in FinishIdleCollect
        inIdleCollect = true;
#endif
        FinishIdleCollect(FinishReason::FinishReasonNormal);
    }
}